

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::PrintMemoryStats(Recycler *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  Output::Print(
               L"----------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"Memory (Bytes) %4s %10s %10s %10s %6s %6s\n",L"Live",L"Free",L"Unused",L"Total",
                L"Free%",L"Unused%");
  Output::Print(
               L"----------------------------------------------------------------------------------------------------------------\n"
               );
  PrintHeapBlockMemoryStats(this,L"Small",LargeBlockTypeCount);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"SmFin",SmallFinalizableBlockType);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"SmSWB",SmallNormalBlockWithBarrierType);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"SmFinSWB",MediumAllocBlockTypeCount);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"SmLeaf",SmallLeafBlockType);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"Medium",MediumNormalBlockType);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"MdFin",MediumFinalizableBlockType);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"MdSWB",MediumNormalBlockWithBarrierType);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"MdFinSWB",MediumFinalizableBlockWithBarrierType);
  Output::Print(L"\n");
  PrintHeapBlockMemoryStats(this,L"MdLeaf",MediumLeafBlockType);
  Output::Print(L"\n");
  uVar1 = (this->collectionStats).largeHeapBlockTotalByteCount;
  uVar2 = (this->collectionStats).heapBlockFreeByteCount[0xb];
  lVar3 = (uVar1 - (this->collectionStats).largeHeapBlockUsedByteCount) - uVar2;
  auVar5._8_8_ = uVar1;
  auVar5._0_8_ = uVar2;
  auVar5 = pblendw((undefined1  [16])0x0,auVar5,0x33);
  dVar4 = ((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
          SUB168(auVar5 | _DAT_002f44e0,8);
  auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  Output::Print(L"  Large: %10d %10d %10d %10d %6.1f %6.1f\n",
                ((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 SUB168(auVar5 | _DAT_002f44e0,0)) / dVar4) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) +
                 (auVar6._8_8_ - 1.9342813113834067e+25)) / dVar4) * 100.0);
  Output::Print(L"\nSmall heap block zeroing stats since last GC\n");
  Output::Print(L"Number of blocks with sweep state empty: normal=%d finalizable=%d leaf=%d\nNumber of blocks zeroed: %d\n"
                ,(ulong)((this->collectionStats).numEmptySmallBlocks[4] +
                        (this->collectionStats).numEmptySmallBlocks[1]),
                (ulong)((this->collectionStats).numEmptySmallBlocks[5] +
                        (this->collectionStats).numEmptySmallBlocks[3] +
                        (this->collectionStats).numEmptySmallBlocks[6] +
                       (this->collectionStats).numEmptySmallBlocks[9]),
                (ulong)((this->collectionStats).numEmptySmallBlocks[10] +
                       (this->collectionStats).numEmptySmallBlocks[8]),
                (ulong)((this->collectionStats).numEmptySmallBlocks[7] +
                       (this->collectionStats).numEmptySmallBlocks[2]),
                (ulong)(this->collectionStats).numZeroedOutSmallBlocks);
  return;
}

Assistant:

void
Recycler::PrintMemoryStats()
{
    Output::Print(_u("----------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("Memory (Bytes) %4s %10s %10s %10s %6s %6s\n"), _u("Live"), _u("Free"), _u("Unused"), _u("Total"), _u("Free%"), _u("Unused%"));
    Output::Print(_u("----------------------------------------------------------------------------------------------------------------\n"));

    PrintHeapBlockMemoryStats(_u("Small"), HeapBlock::SmallNormalBlockType);
    Output::Print(_u("\n"));
    PrintHeapBlockMemoryStats(_u("SmFin"), HeapBlock::SmallFinalizableBlockType);
    Output::Print(_u("\n"));
#ifdef RECYCLER_WRITE_BARRIER
    PrintHeapBlockMemoryStats(_u("SmSWB"), HeapBlock::SmallNormalBlockWithBarrierType);
    Output::Print(_u("\n"));
    PrintHeapBlockMemoryStats(_u("SmFinSWB"), HeapBlock::SmallFinalizableBlockWithBarrierType);
    Output::Print(_u("\n"));
#endif
    PrintHeapBlockMemoryStats(_u("SmLeaf"), HeapBlock::SmallLeafBlockType);
    Output::Print(_u("\n"));
    PrintHeapBlockMemoryStats(_u("Medium"), HeapBlock::MediumNormalBlockType);
    Output::Print(_u("\n"));
    PrintHeapBlockMemoryStats(_u("MdFin"), HeapBlock::MediumFinalizableBlockType);
    Output::Print(_u("\n"));
#ifdef RECYCLER_WRITE_BARRIER
    PrintHeapBlockMemoryStats(_u("MdSWB"), HeapBlock::MediumNormalBlockWithBarrierType);
    Output::Print(_u("\n"));
    PrintHeapBlockMemoryStats(_u("MdFinSWB"), HeapBlock::MediumFinalizableBlockWithBarrierType);
    Output::Print(_u("\n"));
#endif
    PrintHeapBlockMemoryStats(_u("MdLeaf"), HeapBlock::MediumLeafBlockType);
    Output::Print(_u("\n"));

    size_t largeHeapBlockUnusedByteCount = collectionStats.largeHeapBlockTotalByteCount - collectionStats.largeHeapBlockUsedByteCount
        - collectionStats.heapBlockFreeByteCount[HeapBlock::LargeBlockType];
    Output::Print(_u("  Large: %10d %10d %10d %10d %6.1f %6.1f\n"),
        collectionStats.largeHeapBlockUsedByteCount,
        collectionStats.heapBlockFreeByteCount[HeapBlock::LargeBlockType],
        largeHeapBlockUnusedByteCount,
        collectionStats.largeHeapBlockTotalByteCount,
        (double)collectionStats.heapBlockFreeByteCount[HeapBlock::LargeBlockType] / (double)collectionStats.largeHeapBlockTotalByteCount * 100,
        (double)largeHeapBlockUnusedByteCount / (double)collectionStats.largeHeapBlockTotalByteCount * 100);

    Output::Print(_u("\nSmall heap block zeroing stats since last GC\n"));
    Output::Print(_u("Number of blocks with sweep state empty: normal=%d finalizable=%d leaf=%d\nNumber of blocks zeroed: %d\n"),
        collectionStats.numEmptySmallBlocks[HeapBlock::SmallNormalBlockType]
#ifdef RECYCLER_WRITE_BARRIER
        + collectionStats.numEmptySmallBlocks[HeapBlock::SmallNormalBlockWithBarrierType]
#endif
        , collectionStats.numEmptySmallBlocks[HeapBlock::SmallFinalizableBlockType]
#ifdef RECYCLER_WRITE_BARRIER
        + collectionStats.numEmptySmallBlocks[HeapBlock::SmallFinalizableBlockWithBarrierType]
#endif
        + collectionStats.numEmptySmallBlocks[HeapBlock::MediumNormalBlockType]
#ifdef RECYCLER_WRITE_BARRIER
        + collectionStats.numEmptySmallBlocks[HeapBlock::MediumNormalBlockWithBarrierType]
#endif
        , collectionStats.numEmptySmallBlocks[HeapBlock::MediumFinalizableBlockType]
#ifdef RECYCLER_WRITE_BARRIER
        + collectionStats.numEmptySmallBlocks[HeapBlock::MediumFinalizableBlockWithBarrierType]
#endif
        , collectionStats.numEmptySmallBlocks[HeapBlock::SmallLeafBlockType]
        + collectionStats.numEmptySmallBlocks[HeapBlock::MediumLeafBlockType],
        collectionStats.numZeroedOutSmallBlocks);
}